

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heter_queue.h
# Opt level: O1

put_transaction<Func> * __thiscall
density::
heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,void()>,density::basic_default_allocator<65536ul>>
::
start_emplace<density_tests::FunctionQueueSamples<(density::function_type_erasure)1>::func_queue_put_samples(std::ostream&)::Func,int>
          (put_transaction<Func> *__return_storage_ptr__,
          heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,void()>,density::basic_default_allocator<65536ul>>
          *this,int *i_construction_params)

{
  put_transaction<Func> local_30;
  
  local_30.m_put_data = inplace_allocate<0ul,true,4ul,4ul>(this);
  local_30.m_put_data.m_control_block[1].m_next =
       (uintptr_t)
       detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>::Impl<Func>::
       align_invoke_destroy;
  *(int *)local_30.m_put_data.m_user_storage = *i_construction_params;
  __return_storage_ptr__->m_queue =
       (heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>_>
        *)this;
  __return_storage_ptr__->m_put_data = local_30.m_put_data;
  local_30.m_queue =
       (heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>_>
        *)0x0;
  heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>_>
  ::put_transaction<Func>::~put_transaction(&local_30);
  return __return_storage_ptr__;
}

Assistant:

put_transaction<ELEMENT_TYPE> start_emplace(CONSTRUCTION_PARAMS &&... i_construction_params)
        {
            auto push_data = inplace_allocate<
              0,
              true,
              detail::size_of<ELEMENT_TYPE>::value,
              alignof(ELEMENT_TYPE)>();

            RUNTIME_TYPE * type = nullptr;
            try
            {
                auto const type_storage = type_after_control(push_data.m_control_block);
                DENSITY_ASSUME(type_storage != nullptr);
                type = new (type_storage) RUNTIME_TYPE(RUNTIME_TYPE::template make<ELEMENT_TYPE>());

                DENSITY_ASSUME(push_data.m_user_storage != nullptr);
                new (push_data.m_user_storage)
                  ELEMENT_TYPE(std::forward<CONSTRUCTION_PARAMS>(i_construction_params)...);
            }
            catch (...)
            {
                if (type != nullptr)
                    type->RUNTIME_TYPE::~RUNTIME_TYPE();
                DENSITY_ASSERT_INTERNAL(
                  (push_data.m_control_block->m_next & (detail::Queue_Busy | detail::Queue_Dead)) ==
                  0);
                push_data.m_control_block->m_next += detail::Queue_Dead;
                throw;
            }

            return put_transaction<ELEMENT_TYPE>(PrivateType(), this, push_data);
        }